

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  Verbosity old_verbosity;
  Verbosity VVar7;
  char *pcVar8;
  ostream *poVar9;
  data_type *pdVar10;
  longdouble lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  Rational rowviol;
  Rational sumviol;
  Rational maxviol;
  Rational boundviol;
  true_ local_219;
  data_type local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  void *pvStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined1 local_1d4;
  int local_1d0;
  undefined4 uStack_1cc;
  data_type local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  void *pvStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined4 uStack_188;
  undefined1 uStack_184;
  undefined8 local_180;
  data_type local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  void *pvStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  undefined4 uStack_138;
  undefined1 uStack_134;
  undefined8 local_130;
  data_type local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  void *pvStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined5 uStack_e8;
  undefined8 local_e0;
  data_type local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  void *pvStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined4 uStack_98;
  undefined1 uStack_94;
  undefined8 local_90;
  double local_88;
  double local_80;
  data_type local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  void *pvStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  iVar4 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar4 == 2) || ((iVar4 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar7;
      }
    }
    else {
      local_d8.la[0] = 0;
      local_c8 = CONCAT17(local_c8._7_1_,0x10000000001);
      local_b8 = 1;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_1c8.la[0] = 0;
      local_1b8 = CONCAT17(local_1b8._7_1_,0x10000000001);
      local_1a8 = 1;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational(soplex,(Rational *)&local_d8.ld,(Rational *)&local_178.ld)
      ;
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_1c8.ld,(Rational *)&local_178.ld);
        if (!bVar3) goto LAB_0036d1c8;
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_d8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1c8.ld);
          pdVar10 = &local_1c8;
          if (0 < iVar4) {
            pdVar10 = &local_d8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar10->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar8 = "infeasible";
          }
          else {
            lVar11 = (longdouble)dVar1;
            local_218.ld.capacity = SUB104(lVar11,0);
            local_218.la[0]._4_4_ = (undefined4)((unkuint10)lVar11 >> 0x20);
            local_218.la[1]._0_2_ = (undefined2)((unkuint10)lVar11 >> 0x40);
            local_80 = dVar1;
            bVar3 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_128.ld,(longdouble *)&local_218,(true_ *)&local_78.ld);
            pcVar8 = "feasible";
            if (bVar3) {
              pcVar8 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_218.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_218.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_1e8._5_1_ == '\0') && (local_1e8._6_1_ == '\0')) {
            operator_delete(pvStack_1f0,(local_1f8 & 0xffffffff) << 3);
          }
          if ((local_208._5_1_ == '\0') && (local_208._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_218.la[1]._2_6_,local_218.la[1]._0_2_),
                            (ulong)local_218.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar7;
          if ((local_f8._5_1_ == '\0') && (local_f8._6_1_ == '\0')) {
            operator_delete(pvStack_100,(local_108 & 0xffffffff) << 3);
          }
          if ((local_118._5_1_ == '\0') && (local_118._6_1_ == '\0')) {
            operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_0036d1c8:
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar7;
        }
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete(pvStack_150,(local_158 & 0xffffffff) << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(pvStack_1a0,(local_1a8 & 0xffffffff) << 3);
      }
      if ((local_1b8._5_1_ == '\0') && (local_1b8._6_1_ == '\0')) {
        operator_delete(local_1c8.ld.data,(local_1c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(pvStack_b0,(local_b8 & 0xffffffff) << 3);
      }
      if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
        operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_d8.la[0] = 0;
      local_c8 = CONCAT17(local_c8._7_1_,0x10000000001);
      local_b8 = 1;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_1c8.la[0] = 0;
      local_1b8 = CONCAT17(local_1b8._7_1_,0x10000000001);
      local_1a8 = 1;
      local_198 = CONCAT17(local_198._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_d8.ld,(Rational *)&local_178.ld);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_1c8.ld,(Rational *)&local_178.ld);
        if (!bVar3) goto LAB_0036d5b0;
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_d8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1c8.ld);
          pdVar10 = &local_1c8;
          if (0 < iVar4) {
            pdVar10 = &local_d8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar10->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar8 = "infeasible";
          }
          else {
            lVar11 = (longdouble)dVar1;
            local_78.ld.capacity = SUB104(lVar11,0);
            local_78.la[0]._4_4_ = (undefined4)((unkuint10)lVar11 >> 0x20);
            local_78.la[1]._0_2_ = (undefined2)((unkuint10)lVar11 >> 0x40);
            local_88 = dVar1;
            bVar3 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_128.ld,(longdouble *)&local_78,&local_219);
            pcVar8 = "feasible";
            if (bVar3) {
              pcVar8 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_78.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_78.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_48._5_1_ == '\0') && (local_48._6_1_ == '\0')) {
            operator_delete(pvStack_50,(local_58 & 0xffffffff) << 3);
          }
          if ((local_68._5_1_ == '\0') && (local_68._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_78.la[1]._2_6_,local_78.la[1]._0_2_),
                            (ulong)local_78.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar7;
          if ((local_f8._5_1_ == '\0') && (local_f8._6_1_ == '\0')) {
            operator_delete(pvStack_100,(local_108 & 0xffffffff) << 3);
          }
          if ((local_118._5_1_ == '\0') && (local_118._6_1_ == '\0')) {
            operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_0036d5b0:
        VVar7 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar7) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar7;
        }
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete(pvStack_150,(local_158 & 0xffffffff) << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
        operator_delete(pvStack_1a0,(local_1a8 & 0xffffffff) << 3);
      }
      if ((local_1b8._5_1_ == '\0') && (local_1b8._6_1_ == '\0')) {
        operator_delete(local_1c8.ld.data,(local_1c8.la[0] & 0xffffffff) << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(pvStack_b0,(local_b8 & 0xffffffff) << 3);
      }
      if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
        operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
      }
      VVar7 = (soplex->spxout).m_verbosity;
      goto LAB_0036dc11;
    }
    VVar7 = (soplex->spxout).m_verbosity;
LAB_0036d8bb:
    if ((int)VVar7 < 3) goto LAB_0036dc11;
    (soplex->spxout).m_verbosity = INFO1;
    poVar9 = (soplex->spxout).m_streams[3];
    pcVar8 = "No dual solution available.\n";
    lVar6 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar9 = (soplex->spxout).m_streams[3];
        pcVar8 = "No primal solution available.\n";
        lVar6 = 0x1e;
LAB_0036d8a1:
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,lVar6);
        (soplex->spxout).m_verbosity = VVar7;
      }
    }
    else {
      local_180 = 0x1000000000;
      local_1c8.la[0] = 0;
      local_1c8.ld.data = (limb_pointer)0x0;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = 0;
      pvStack_1a0 = (void *)0x0;
      local_198 = 0;
      uStack_190 = 0;
      uStack_18b = 0;
      uStack_188 = 0;
      uStack_184 = 0;
      local_130 = 0x1000000000;
      local_178.la[0] = 0;
      local_178.ld.data = (limb_pointer)0x0;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0;
      pvStack_150 = (void *)0x0;
      local_148 = 0;
      uStack_140 = 0;
      uStack_13b = 0;
      uStack_138 = 0;
      uStack_134 = 0;
      local_e0 = 0x1000000000;
      local_128.la[0] = 0;
      local_128.ld.data = (limb_pointer)0x0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      pvStack_100 = (void *)0x0;
      local_f8 = 0;
      uStack_f0 = 0;
      uStack_eb = 0;
      uStack_e8 = 0;
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_1c8.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_128.ld);
      if (bVar3) {
        bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_178.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_128.ld);
        if (bVar3) {
          VVar7 = (soplex->spxout).m_verbosity;
          if ((int)VVar7 < 3) goto LAB_0036d8a9;
          (soplex->spxout).m_verbosity = INFO1;
          if ((int)local_130 == 2 || (int)local_180 == 2) {
LAB_0036d6e6:
            puVar2 = &local_130;
            uStack_1e0 = CONCAT35(uStack_13b,uStack_140);
            local_1e8 = local_148;
            local_1f8 = local_158;
            pvStack_1f0 = pvStack_150;
            local_208 = local_168;
            uStack_200 = uStack_160;
            local_218.ld.capacity = (uint)local_178.la[0];
            local_218.la[0]._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
            local_218.la[1]._0_2_ = (undefined2)local_178.la[1];
            local_218.la[1]._2_6_ = (undefined6)((ulong)local_178._8_8_ >> 0x10);
            local_1d8 = uStack_138;
            local_1d4 = uStack_134;
            local_1d0 = (int)local_130;
          }
          else {
            iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)&local_1c8.ld,
                               (cpp_dec_float<100U,_int,_void> *)&local_178.ld);
            if (iVar4 < 1) {
              goto LAB_0036d6e6;
            }
            puVar2 = &local_180;
            uStack_1e0 = CONCAT35(uStack_18b,uStack_190);
            local_1e8 = local_198;
            local_1f8 = local_1a8;
            pvStack_1f0 = pvStack_1a0;
            local_208 = local_1b8;
            uStack_200 = uStack_1b0;
            local_218.ld.capacity = (uint)local_1c8.la[0];
            local_218.la[0]._4_4_ = (undefined4)((ulong)local_1c8._0_8_ >> 0x20);
            local_218.la[1]._0_2_ = (undefined2)local_1c8.la[1];
            local_218.la[1]._2_6_ = (undefined6)((ulong)local_1c8._8_8_ >> 0x10);
            local_1d8 = uStack_188;
            local_1d4 = uStack_184;
            local_1d0 = (int)local_180;
          }
          uStack_1cc = *(undefined4 *)((long)puVar2 + 4);
          pcVar8 = "infeasible";
          if ((local_1d0 != 2) &&
             (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
            local_90 = 0x1000000000;
            local_d8.la[0] = 0;
            local_d8.ld.data = (limb_pointer)0x0;
            local_c8 = 0;
            uStack_c0 = 0;
            local_b8 = 0;
            pvStack_b0 = (void *)0x0;
            local_a8 = 0;
            uStack_a0 = 0;
            uStack_9b = 0;
            uStack_98 = 0;
            uStack_94 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_d8.ld,dVar1);
            iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)&local_218.ld,
                               (cpp_dec_float<100U,_int,_void> *)&local_d8.ld);
            pcVar8 = "infeasible";
            if (iVar4 < 1) {
              pcVar8 = "feasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar5 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 0x100;
          local_48 = local_1e8;
          uStack_40 = uStack_1e0;
          local_58 = local_1f8;
          pvStack_50 = pvStack_1f0;
          local_68 = local_208;
          uStack_60 = uStack_200;
          local_78.ld.capacity = local_218.ld.capacity;
          local_78.la[0]._4_4_ = local_218.la[0]._4_4_;
          local_78.la[1]._0_2_ = local_218.la[1]._0_2_;
          local_78.la[1]._2_6_ = local_218.la[1]._2_6_;
          local_38 = local_1d8;
          local_34 = local_1d4;
          local_30 = CONCAT44(uStack_1cc,local_1d0);
          boost::multiprecision::operator<<
                    (poVar9,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_78.ld);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar6 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar6 + -0x18) + 8) = 8;
          lVar6 = *(long *)(lVar6 + -0x18);
          *(uint *)(poVar9 + lVar6 + 0x18) = *(uint *)(poVar9 + lVar6 + 0x18) & 0xfffffefb | 4;
          pcVar8 = ").\n";
          lVar6 = 3;
          goto LAB_0036d8a1;
        }
      }
      VVar7 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar9 = (soplex->spxout).m_streams[3];
        pcVar8 = "Could not check primal solution.\n";
        lVar6 = 0x21;
        goto LAB_0036d8a1;
      }
    }
LAB_0036d8a9:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_0036d8bb;
    local_180 = 0x1000000000;
    local_1c8.la[0] = 0;
    local_1c8.ld.data = (limb_pointer)0x0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = 0;
    pvStack_1a0 = (void *)0x0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_18b = 0;
    uStack_188 = 0;
    uStack_184 = 0;
    local_130 = 0x1000000000;
    local_178.la[0] = 0;
    local_178.ld.data = (limb_pointer)0x0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    pvStack_150 = (void *)0x0;
    local_148 = 0;
    uStack_140 = 0;
    uStack_13b = 0;
    uStack_138 = 0;
    uStack_134 = 0;
    local_e0 = 0x1000000000;
    local_128.la[0] = 0;
    local_128.ld.data = (limb_pointer)0x0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    pvStack_100 = (void *)0x0;
    local_f8 = 0;
    uStack_f0 = 0;
    uStack_eb = 0;
    uStack_e8 = 0;
    bVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1c8.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128.ld);
    if (bVar3) {
      bVar3 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_178.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_128.ld);
      if (!bVar3) goto LAB_0036da1b;
      VVar7 = (soplex->spxout).m_verbosity;
      if ((int)VVar7 < 3) goto LAB_0036dc11;
      (soplex->spxout).m_verbosity = INFO1;
      if ((int)local_130 == 2 || (int)local_180 == 2) {
LAB_0036da4e:
        puVar2 = &local_130;
        uStack_1e0 = CONCAT35(uStack_13b,uStack_140);
        local_1e8 = local_148;
        local_1f8 = local_158;
        pvStack_1f0 = pvStack_150;
        local_208 = local_168;
        uStack_200 = uStack_160;
        local_218.ld.capacity = (uint)local_178.la[0];
        local_218.la[0]._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
        local_218.la[1]._0_2_ = (undefined2)local_178.la[1];
        local_218.la[1]._2_6_ = (undefined6)((ulong)local_178._8_8_ >> 0x10);
        local_1d8 = uStack_138;
        local_1d4 = uStack_134;
        local_1d0 = (int)local_130;
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)&local_1c8.ld,
                           (cpp_dec_float<100U,_int,_void> *)&local_178.ld);
        if (iVar4 < 1) {
          goto LAB_0036da4e;
        }
        puVar2 = &local_180;
        uStack_1e0 = CONCAT35(uStack_18b,uStack_190);
        local_1e8 = local_198;
        local_1f8 = local_1a8;
        pvStack_1f0 = pvStack_1a0;
        local_208 = local_1b8;
        uStack_200 = uStack_1b0;
        local_218.ld.capacity = (uint)local_1c8.la[0];
        local_218.la[0]._4_4_ = (undefined4)((ulong)local_1c8._0_8_ >> 0x20);
        local_218.la[1]._0_2_ = (undefined2)local_1c8.la[1];
        local_218.la[1]._2_6_ = (undefined6)((ulong)local_1c8._8_8_ >> 0x10);
        local_1d8 = uStack_188;
        local_1d4 = uStack_184;
        local_1d0 = (int)local_180;
      }
      uStack_1cc = *(undefined4 *)((long)puVar2 + 4);
      pcVar8 = "infeasible";
      if ((local_1d0 != 2) && (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1)))
      {
        local_90 = 0x1000000000;
        local_d8.la[0] = 0;
        local_d8.ld.data = (limb_pointer)0x0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_b8 = 0;
        pvStack_b0 = (void *)0x0;
        local_a8 = 0;
        uStack_a0 = 0;
        uStack_9b = 0;
        uStack_98 = 0;
        uStack_94 = 0;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_d8.ld,dVar1);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)&local_218.ld,
                           (cpp_dec_float<100U,_int,_void> *)&local_d8.ld);
        pcVar8 = "infeasible";
        if (iVar4 < 1) {
          pcVar8 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar5 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_d8.la[0] = CONCAT44(local_218.la[0]._4_4_,local_218.ld.capacity);
      local_d8.la[1] = CONCAT62(local_218.la[1]._2_6_,local_218.la[1]._0_2_);
      local_a8 = local_1e8;
      uStack_a0 = (undefined5)uStack_1e0;
      uStack_9b = (undefined3)((ulong)uStack_1e0 >> 0x28);
      local_b8 = local_1f8;
      pvStack_b0 = pvStack_1f0;
      local_c8 = local_208;
      uStack_c0 = uStack_200;
      uStack_98 = local_1d8;
      uStack_94 = local_1d4;
      local_90 = CONCAT44(uStack_1cc,local_1d0);
      boost::multiprecision::operator<<
                (poVar9,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d8.ld);
      poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar6 = *(long *)poVar9;
      *(undefined8 *)(poVar9 + *(long *)(lVar6 + -0x18) + 8) = 8;
      lVar6 = *(long *)(lVar6 + -0x18);
      *(uint *)(poVar9 + lVar6 + 0x18) = *(uint *)(poVar9 + lVar6 + 0x18) & 0xfffffefb | 4;
      pcVar8 = ").\n";
      lVar6 = 3;
    }
    else {
LAB_0036da1b:
      VVar7 = (soplex->spxout).m_verbosity;
      if ((int)VVar7 < 3) goto LAB_0036dc11;
      (soplex->spxout).m_verbosity = INFO1;
      poVar9 = (soplex->spxout).m_streams[3];
      pcVar8 = "Could not check dual solution.\n";
      lVar6 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,lVar6);
  (soplex->spxout).m_verbosity = VVar7;
LAB_0036dc11:
  if (2 < (int)VVar7) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar7;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}